

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O0

void wrapText(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *lines,string *text,int width,bool hyphenate)

{
  bool bVar1;
  uint local_44;
  string local_40 [4];
  uint offset;
  string line;
  bool hyphenate_local;
  int width_local;
  string *text_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lines_local;
  
  std::__cxx11::string::string(local_40);
  local_44 = 0;
  while( true ) {
    bVar1 = extractLine((string *)local_40,text,width,hyphenate,&local_44);
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(lines,(value_type *)local_40);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void wrapText (
  std::vector <std::string>& lines,
  const std::string& text,
  const int width,
  bool hyphenate)
{
  std::string line;
  unsigned int offset = 0;
  while (extractLine (line, text, width, hyphenate, offset))
    lines.push_back (line);
}